

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O0

int PSolve(sunrealtype t,N_Vector c,N_Vector fc,N_Vector r,N_Vector z,sunrealtype gamma,
          sunrealtype delta,int lr,void *user_data)

{
  double dVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  N_Vector c_00;
  long lVar7;
  long lVar8;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_R9;
  sunrealtype sVar9;
  double in_XMM1_Qa;
  WebData wdata;
  int mp;
  int ngx;
  int my;
  int mx;
  int *jigy;
  int *jigx;
  int ig;
  int iv;
  int igy;
  int igx;
  int jy;
  int jx;
  sunindextype **pivot;
  sunrealtype ***P;
  int iVar10;
  int iVar11;
  int i;
  int local_6c;
  int local_60;
  int local_5c;
  
  N_VScale(0x3ff0000000000000,in_RDX,in_RCX);
  GSIter(t,c,fc,(WebData)r);
  i = *(int *)(in_R9 + 0x50);
  iVar2 = *(int *)(in_R9 + 0x54);
  iVar11 = *(int *)(in_R9 + 0x5c);
  iVar10 = *(int *)(in_R9 + 0x48);
  c_00 = (N_Vector)(in_R9 + 0xd0);
  local_6c = 0;
  for (local_60 = 0; local_60 < iVar2; local_60 = local_60 + 1) {
    iVar3 = *(int *)((long)&c_00->content + (long)local_60 * 4);
    for (local_5c = 0; local_5c < i; local_5c = local_5c + 1) {
      iVar6 = *(int *)(in_R9 + 0x80 + (long)local_5c * 4) + iVar3 * iVar11;
      uVar4 = *(undefined8 *)(in_R9 + (long)iVar6 * 8);
      lVar7 = (long)iVar10;
      uVar5 = *(undefined8 *)(in_R9 + 0x20 + (long)iVar6 * 8);
      lVar8 = N_VGetArrayPointer(in_RCX);
      SUNDlsMat_denseGETRS(uVar4,lVar7,uVar5,lVar8 + (long)local_6c * 8);
      local_6c = iVar10 + local_6c;
    }
  }
  lVar7 = N_VGetArrayPointer(in_RDX);
  dVar1 = *(double *)(lVar7 + 0x4b00);
  sVar9 = doubleIntgr(c_00,i,(WebData)CONCAT44(iVar11,iVar10));
  lVar7 = N_VGetArrayPointer(in_RCX);
  *(double *)(lVar7 + 0x4b00) = in_XMM1_Qa * sVar9 + dVar1;
  return 0;
}

Assistant:

static int PSolve(sunrealtype t, N_Vector c, N_Vector fc, N_Vector r, N_Vector z,
                  sunrealtype gamma, sunrealtype delta, int lr, void* user_data)
{
  sunrealtype*** P;
  sunindextype** pivot;
  int jx, jy, igx, igy, iv, ig, *jigx, *jigy, mx, my, ngx, mp;
  WebData wdata;

  wdata = (WebData)user_data;

  N_VScale(ONE, r, z);

  /* call GSIter for Gauss-Seidel iterations */

  GSIter(gamma, z, wdata->vtemp, wdata);

  /* Do backsolves for inverse of block-diagonal preconditioner factor */

  P     = wdata->P;
  pivot = wdata->pivot;
  mx    = wdata->mx;
  my    = wdata->my;
  ngx   = wdata->ngx;
  mp    = wdata->mp;
  jigx  = wdata->jigx;
  jigy  = wdata->jigy;

  iv = 0;
  for (jy = 0; jy < my; jy++)
  {
    igy = jigy[jy];
    for (jx = 0; jx < mx; jx++)
    {
      igx = jigx[jx];
      ig  = igx + igy * ngx;
      SUNDlsMat_denseGETRS(P[ig], mp, pivot[ig], &(N_VGetArrayPointer(z)[iv]));
      iv += mp;
    }
  }

  /* Solve for the quadrature variable */
  N_VGetArrayPointer(z)[NEQ] = N_VGetArrayPointer(r)[NEQ] +
                               gamma * doubleIntgr(z, ISPEC, wdata);

  return (0);
}